

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lower.cpp
# Opt level: O0

Instr * __thiscall
Lowerer::LowerBinaryHelperMem(Lowerer *this,Instr *instr,JnHelperMethod helperMethod)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  Instr *pIVar4;
  bool local_41;
  OpLayoutType local_38;
  OpLayoutType local_34;
  OpLayoutType local_30;
  OpLayoutType local_2c;
  Instr *local_28;
  Instr *instrPrev;
  Instr *pIStack_18;
  JnHelperMethod helperMethod_local;
  Instr *instr_local;
  Lowerer *this_local;
  
  instrPrev._4_4_ = helperMethod;
  pIStack_18 = instr;
  instr_local = (Instr *)this;
  local_2c = Js::OpCodeUtil::GetOpCodeLayout(instr->m_opcode);
  bVar2 = Js::OpLayoutType::operator==(&local_2c,Reg3);
  local_41 = true;
  if (!bVar2) {
    local_30 = Js::OpCodeUtil::GetOpCodeLayout(pIStack_18->m_opcode);
    bVar2 = Js::OpLayoutType::operator==(&local_30,Reg2);
    local_41 = true;
    if (!bVar2) {
      local_34 = Js::OpCodeUtil::GetOpCodeLayout(pIStack_18->m_opcode);
      bVar2 = Js::OpLayoutType::operator==(&local_34,Reg2Int1);
      local_41 = true;
      if (!bVar2) {
        local_38 = Js::OpCodeUtil::GetOpCodeLayout(pIStack_18->m_opcode);
        local_41 = Js::OpLayoutType::operator==(&local_38,Reg1Unsigned1);
      }
    }
  }
  if (((local_41 ^ 0xffU) & 1) != 0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x2264,
                       "(Js::OpCodeUtil::GetOpCodeLayout(instr->m_opcode) == Js::OpLayoutType::Reg3 || Js::OpCodeUtil::GetOpCodeLayout(instr->m_opcode) == Js::OpLayoutType::Reg2 || Js::OpCodeUtil::GetOpCodeLayout(instr->m_opcode) == Js::OpLayoutType::Reg2Int1 || Js::OpCodeUtil::GetOpCodeLayout(instr->m_opcode) == Js::OpLayoutType::Reg1Unsigned1)"
                       ,"Expected a binary instruction...");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 0;
  }
  local_28 = LoadScriptContext(this,pIStack_18);
  pIVar4 = LowerBinaryHelper(this,pIStack_18,instrPrev._4_4_);
  return pIVar4;
}

Assistant:

IR::Instr *
Lowerer::LowerBinaryHelperMem(IR::Instr *instr, IR::JnHelperMethod helperMethod)
{
    IR::Instr *instrPrev;

    AssertMsg(Js::OpCodeUtil::GetOpCodeLayout(instr->m_opcode) == Js::OpLayoutType::Reg3 ||
              Js::OpCodeUtil::GetOpCodeLayout(instr->m_opcode) == Js::OpLayoutType::Reg2 ||
              Js::OpCodeUtil::GetOpCodeLayout(instr->m_opcode) == Js::OpLayoutType::Reg2Int1 ||
              Js::OpCodeUtil::GetOpCodeLayout(instr->m_opcode) == Js::OpLayoutType::Reg1Unsigned1, "Expected a binary instruction...");

    instrPrev = LoadScriptContext(instr);

    return this->LowerBinaryHelper(instr, helperMethod);
}